

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall
fasttext::ProductQuantizer::kmeans(ProductQuantizer *this,real *x,real *c,int32_t n,int32_t d)

{
  void *pvVar1;
  ProductQuantizer *pPVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint n_00;
  long lVar6;
  uint8_t *code;
  real *prVar7;
  real *prVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> codes;
  vector<int,_std::allocator<int>_> perm;
  allocator_type local_99;
  ProductQuantizer *local_98;
  uint local_8c;
  long local_88;
  real *local_80;
  size_type local_78;
  real *local_70;
  int *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_78 = (size_type)n;
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  local_80 = c;
  local_70 = x;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,local_78,(value_type_conflict1 *)&local_60,&local_99);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    auVar9 = vpmovsxbd_avx512f(_DAT_00142010);
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar11 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar12 = vpbroadcastd_avx512f(ZEXT416(0x10));
    uVar5 = 0;
    auVar13 = vpbroadcastq_avx512f();
    auVar13 = vpsrlq_avx512f(auVar13,2);
    do {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vporq_avx512f(auVar14,auVar10);
      auVar14 = vporq_avx512f(auVar14,auVar11);
      vpcmpuq_avx512f(auVar14,auVar13,2);
      vpcmpuq_avx512f(auVar15,auVar13,2);
      auVar14 = vmovdqu32_avx512f(auVar9);
      *(undefined1 (*) [64])
       (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start + uVar5) = auVar14;
      uVar5 = uVar5 + 0x10;
      auVar9 = vpaddd_avx512f(auVar9,auVar12);
    } while ((((ulong)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                      (-4 - (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start)) >> 2) + 0x10 &
             0xfffffffffffffff0) != uVar5);
  }
  local_8c = n;
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish,&this->rng);
  prVar7 = local_70;
  lVar4 = (long)d;
  local_88 = lVar4;
  if (0 < this->ksub_) {
    lVar6 = 0;
    local_68 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    prVar8 = local_80;
    local_98 = (ProductQuantizer *)(lVar4 * 4);
    do {
      memcpy(prVar8,prVar7 + local_68[lVar6] * local_88,lVar4 * 4);
      lVar6 = lVar6 + 1;
      prVar8 = prVar8 + lVar4;
    } while (lVar6 < this->ksub_);
  }
  local_98 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,local_78,(allocator_type *)&local_99);
  if (0 < local_98->niter_) {
    local_88 = local_88 << 2;
    local_78 = (size_type)local_8c;
    iVar3 = 0;
    prVar7 = local_70;
    prVar8 = local_80;
    n_00 = local_8c;
    do {
      lVar4 = local_88;
      pPVar2 = local_98;
      code = (uint8_t *)
             CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_);
      local_68 = (int *)CONCAT44(local_68._4_4_,iVar3);
      uVar5 = local_78;
      if (0 < (int)n_00) {
        do {
          assign_centroid(pPVar2,prVar7,local_80,code,d);
          code = code + 1;
          prVar7 = (real *)((long)prVar7 + lVar4);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        code = (uint8_t *)
               CONCAT44(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_);
        prVar7 = local_70;
        prVar8 = local_80;
        n_00 = local_8c;
      }
      pPVar2 = local_98;
      MStep(local_98,prVar7,prVar8,code,d,n_00);
      iVar3 = (int)local_68 + 1;
    } while (iVar3 < pPVar2->niter_);
  }
  pvVar1 = (void *)CONCAT44(local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_60.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProductQuantizer::kmeans(const real* x, real* c, int32_t n, int32_t d) {
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  std::shuffle(perm.begin(), perm.end(), rng);
  for (auto i = 0; i < ksub_; i++) {
    memcpy(&c[i * d], x + perm[i] * d, d * sizeof(real));
  }
  auto codes = std::vector<uint8_t>(n);
  for (auto i = 0; i < niter_; i++) {
    Estep(x, c, codes.data(), d, n);
    MStep(x, c, codes.data(), d, n);
  }
}